

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

void BinaryenConstSetValueV128(BinaryenExpressionRef expr,uint8_t *value)

{
  bool bVar1;
  Literal local_38;
  BinaryenExpressionRef local_20;
  Expression *expression;
  uint8_t *value_local;
  BinaryenExpressionRef expr_local;
  
  local_20 = expr;
  expression = (Expression *)value;
  value_local = (uint8_t *)expr;
  bVar1 = wasm::Expression::is<wasm::Const>(expr);
  if (!bVar1) {
    __assert_fail("expression->is<Const>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xb18,"void BinaryenConstSetValueV128(BinaryenExpressionRef, const uint8_t *)");
  }
  if (expression != (Expression *)0x0) {
    wasm::Literal::Literal(&local_38,(uint8_t *)expression);
    wasm::Literal::operator=((Literal *)(local_20 + 1),&local_38);
    wasm::Literal::~Literal(&local_38);
    return;
  }
  __assert_fail("value",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xb19,"void BinaryenConstSetValueV128(BinaryenExpressionRef, const uint8_t *)");
}

Assistant:

void BinaryenConstSetValueV128(BinaryenExpressionRef expr,
                               const uint8_t value[16]) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Const>());
  assert(value); // nullptr would be wrong
  static_cast<Const*>(expression)->value = Literal(value);
}